

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O0

uint parse_unsigned(char *valname,char *prog)

{
  int iVar1;
  uint local_1c;
  char *pcStack_18;
  uint val;
  char *prog_local;
  char *valname_local;
  
  pcStack_18 = prog;
  prog_local = valname;
  iVar1 = str_to_unsigned(_optarg,&local_1c);
  if (iVar1 != 0) {
    fprintf(_stderr,"invalid %s value\n",prog_local);
    printf(usage_str,pcStack_18);
    exit(1);
  }
  return local_1c;
}

Assistant:

static unsigned
parse_unsigned(const char *valname, const char *prog)
{
	unsigned val;
	if (str_to_unsigned(optarg, &val) != 0) {
		fprintf(stderr, "invalid %s value\n", valname);
		printf(usage_str, prog);
		exit(1);
	}
	return val;
}